

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbi.cpp
# Opt level: O0

void __thiscall
icu_63::RuleBasedBreakIterator::adoptText(RuleBasedBreakIterator *this,CharacterIterator *newText)

{
  int32_t iVar1;
  UErrorCode local_1c;
  CharacterIterator *pCStack_18;
  UErrorCode status;
  CharacterIterator *newText_local;
  RuleBasedBreakIterator *this_local;
  
  pCStack_18 = newText;
  newText_local = (CharacterIterator *)this;
  if (((StringCharacterIterator *)this->fCharIter != &this->fSCharIter) &&
     (this->fCharIter != (CharacterIterator *)0x0)) {
    (*(this->fCharIter->super_ForwardCharacterIterator).super_UObject._vptr_UObject[1])();
  }
  this->fCharIter = pCStack_18;
  local_1c = U_ZERO_ERROR;
  BreakCache::reset(this->fBreakCache,0,0);
  DictionaryCache::reset(this->fDictionaryCache);
  if ((pCStack_18 == (CharacterIterator *)0x0) ||
     (iVar1 = CharacterIterator::startIndex(pCStack_18), iVar1 != 0)) {
    utext_openUChars_63(&this->fText,(UChar *)0x0,0,&local_1c);
  }
  else {
    utext_openCharacterIterator_63(&this->fText,pCStack_18,&local_1c);
  }
  (*(this->super_BreakIterator).super_UObject._vptr_UObject[10])();
  return;
}

Assistant:

void
RuleBasedBreakIterator::adoptText(CharacterIterator* newText) {
    // If we are holding a CharacterIterator adopted from a
    //   previous call to this function, delete it now.
    if (fCharIter != &fSCharIter) {
        delete fCharIter;
    }

    fCharIter = newText;
    UErrorCode status = U_ZERO_ERROR;
    fBreakCache->reset();
    fDictionaryCache->reset();
    if (newText==NULL || newText->startIndex() != 0) {
        // startIndex !=0 wants to be an error, but there's no way to report it.
        // Make the iterator text be an empty string.
        utext_openUChars(&fText, NULL, 0, &status);
    } else {
        utext_openCharacterIterator(&fText, newText, &status);
    }
    this->first();
}